

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzblockdiag.cpp
# Opt level: O1

int __thiscall
TPZBlockDiagonal<double>::Substitution(TPZBlockDiagonal<double> *this,TPZFMatrix<double> *B)

{
  long lVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  long lVar5;
  long rows;
  long lVar6;
  TPZFMatrix<double> BTemp;
  long local_100;
  TPZFMatrix<double> local_c0;
  
  if ((this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed != '\x01') {
    TPZMatrix<double>::Error
              ("virtual int TPZBlockDiagonal<double>::Substitution(TPZFMatrix<TVar> *) const [TVar = double]"
               ,"TPZBlockDiagonal::Decompose_LU is decomposed with other scheme");
  }
  lVar1 = (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
  if (0 < lVar1) {
    lVar2 = (this->fBlockSize).fNElements;
    local_100 = 0;
    do {
      if (0 < lVar2) {
        lVar6 = 0;
        lVar5 = 0;
        do {
          rows = (long)(this->fBlockSize).fStore[lVar6];
          if (rows != 0) {
            lVar3 = (this->fBlockPos).fStore[lVar6];
            if (((lVar5 < 0) || ((B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= lVar5)) ||
               ((B->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= local_100)) {
              TPZFMatrix<double>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            local_c0.fElem =
                 B->fElem +
                 (B->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * local_100 + lVar5;
            local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fCol = 1;
            local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDecomposed = '\0';
            local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fDefPositive = '\0';
            local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable =
                 (_func_int **)&PTR__TPZFMatrix_0183c898;
            local_c0.super_TPZMatrix<double>.super_TPZBaseMatrix.fRow = rows;
            local_c0.fGiven = local_c0.fElem;
            local_c0.fSize = rows;
            TPZVec<int>::TPZVec(&local_c0.fPivot.super_TPZVec<int>,0);
            local_c0.fPivot.super_TPZVec<int>._vptr_TPZVec =
                 (_func_int **)&PTR__TPZManVector_0183cde8;
            local_c0.fPivot.super_TPZVec<int>.fStore = local_c0.fPivot.fExtAlloc;
            local_c0.fPivot.super_TPZVec<int>.fNElements = 0;
            local_c0.fPivot.super_TPZVec<int>.fNAlloc = 0;
            local_c0.fWork._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b4b0;
            local_c0.fWork.fStore = (double *)0x0;
            local_c0.fWork.fNElements = 0;
            local_c0.fWork.fNAlloc = 0;
            pdVar4 = TPZVec<double>::begin(&this->fStorage);
            TPZFMatrix<double>::Substitution(pdVar4 + lVar3,rows,&local_c0);
            lVar5 = lVar5 + rows;
            TPZFMatrix<double>::~TPZFMatrix(&local_c0);
          }
          lVar6 = lVar6 + 1;
        } while (lVar2 != lVar6);
      }
      local_100 = local_100 + 1;
    } while (local_100 != lVar1);
  }
  return 1;
}

Assistant:

int
TPZBlockDiagonal<TVar>::Substitution( TPZFMatrix<TVar> *B) const
{
	if(this->fDecomposed != ELU) {
		TPZMatrix<TVar>::Error(__PRETTY_FUNCTION__,"TPZBlockDiagonal::Decompose_LU is decomposed with other scheme");
	}
	
	int64_t b,nb,pos,bsize,eq=0;
	nb = fBlockSize.NElements();
	int64_t c, nc = B->Cols();
	for(c=0; c<nc; c++) {
		eq = 0;
		for(b=0;b<nb; b++) {
			pos = fBlockPos[b];
			bsize = fBlockSize[b];
			if(!bsize) continue;
			TPZFMatrix<TVar> BTemp(bsize,1,&(B->operator()(eq,c)),bsize);
			TVar *ptr = fStorage.begin()+pos;
			TPZFMatrix<TVar>::Substitution(ptr,bsize,&BTemp);
			eq+= bsize;
		}
	}
	return 1;
}